

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O2

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix4<4l>
          (fft<float,2048l,(re::fft::direction)1> *this,span<std::complex<float>,_4L> out)

{
  complex<float> *b;
  complex<float> *a;
  long lVar1;
  bool bVar2;
  
  b = (complex<float> *)((long)out.storage_.data_ + 0x18);
  bVar2 = true;
  lVar1 = 0;
  while (bVar2) {
    a = (complex<float> *)((long)out.storage_.data_ + lVar1 * 8);
    scissors<float>(a,(complex<float> *)((long)out.storage_.data_ + 8));
    scissors<float>((complex<float> *)((long)out.storage_.data_ + 0x10),b);
    scissors<float>(a,(complex<float> *)((long)out.storage_.data_ + 0x10));
    b->_M_value = CONCAT44((int)b->_M_value,(int)(b->_M_value >> 0x20)) ^ 0x80000000;
    bVar2 = false;
    scissors<float>((complex<float> *)((long)out.storage_.data_ + 8),b);
    lVar1 = 1;
  }
  return;
}

Assistant:

inline void
    butterfly_radix4(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 0; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[2*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[1*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[3*i*s]);
            }
            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 0*m], out[i + 2*m]);
            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
        }
    }